

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttrAsmJs.cpp
# Opt level: O2

int OpCodeAttrAsmJs::GetOpCodeAttributes(OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int *piVar4;
  
  if (op < InvalidOpCode) {
    if (Simd128_LdSlot_I16 < op) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendOpCodeAttrAsmJs.cpp"
                         ,0x27,"(opIndex < (sizeof(*__countof_helper(OpcodeAttributesAsmJs)) + 0))",
                         "opIndex < (sizeof(*__countof_helper(OpcodeAttributesAsmJs)) + 0)");
      if (!bVar2) {
LAB_003c01a8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    piVar4 = (int *)(OpcodeAttributesAsmJs + (ulong)op * 4);
  }
  else {
    if (0x171 < op - 0x100) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendOpCodeAttrAsmJs.cpp"
                         ,0x2b,
                         "(opIndex < (sizeof(*__countof_helper(ExtendedOpcodeAttributesAsmJs)) + 0))"
                         ,"opIndex < (sizeof(*__countof_helper(ExtendedOpcodeAttributesAsmJs)) + 0)"
                        );
      if (!bVar2) goto LAB_003c01a8;
      *puVar3 = 0;
    }
    piVar4 = (int *)(ExtendedOpcodeAttributesAsmJs + (ulong)(op - 0x100) * 4);
  }
  return *piVar4;
}

Assistant:

static const int GetOpCodeAttributes( Js::OpCodeAsmJs op )
    {
        uint opIndex = (uint)op;
        if (opIndex <= (uint)Js::OpCodeAsmJs::MaxByteSizedOpcodes)
        {
            AnalysisAssert(opIndex < _countof(OpcodeAttributesAsmJs));
            return OpcodeAttributesAsmJs[opIndex];
        }
        opIndex -= ( Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1 );
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeAttributesAsmJs));
        return ExtendedOpcodeAttributesAsmJs[opIndex];
    }